

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

pair<unsigned_long,_robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
 __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::insertKeyPrepareEmptySpot<std::__cxx11::string_const&>
          (Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  pointer __s1;
  size_t __n;
  undefined8 *puVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  undefined8 in_RCX;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  pair<unsigned_long,_robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar15;
  undefined8 local_50;
  ulong local_40;
  
  iVar9 = 0;
  local_50 = in_RCX;
  do {
    sVar10 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)this,key);
    uVar14 = sVar10 * *(long *)(this + 0x10) >> 0x21 ^ sVar10 * *(long *)(this + 0x10);
    iVar4 = *(int *)(this + 0x40);
    uVar12 = ((uint)uVar14 & 0x1f) >> ((ulong)(byte)this[0x44] & 0x3f);
    sVar10 = uVar14 >> 5 & *(ulong *)(this + 0x30);
    lVar13 = *(long *)(this + 0x20);
    bVar3 = *(byte *)(lVar13 + sVar10);
    while (uVar12 = uVar12 + iVar4, uVar12 < bVar3) {
      pbVar2 = (byte *)(lVar13 + 1 + sVar10);
      sVar10 = sVar10 + 1;
      bVar3 = *pbVar2;
    }
    if (uVar12 == *(byte *)(lVar13 + sVar10)) {
      lVar11 = *(long *)(this + 0x18);
      __s1 = (key->_M_dataplus)._M_p;
      __n = key->_M_string_length;
      do {
        puVar5 = *(undefined8 **)(lVar11 + sVar10 * 8);
        if (__n == puVar5[1]) {
          if (__n != 0) {
            iVar8 = bcmp(__s1,(void *)*puVar5,__n);
            if (iVar8 != 0) goto LAB_0010f339;
          }
          bVar6 = false;
          local_50 = 1;
          goto LAB_0010f3be;
        }
LAB_0010f339:
        uVar12 = uVar12 + iVar4;
        pbVar2 = (byte *)(lVar13 + 1 + sVar10);
        sVar10 = sVar10 + 1;
      } while (uVar12 == *pbVar2);
    }
    if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x38)) {
      if (0xff < iVar4 + uVar12) {
        *(undefined8 *)(this + 0x38) = 0;
      }
      lVar11 = 1;
      do {
        lVar11 = lVar11 + -1;
        pcVar1 = (char *)(lVar13 + sVar10);
        lVar13 = lVar13 + 1;
      } while (*pcVar1 != '\0');
      if (lVar11 == 0) {
        local_50 = 2;
      }
      else {
        Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,sVar10 - lVar11,sVar10);
        local_50 = 3;
      }
      *(char *)(*(long *)(this + 0x20) + sVar10) = (char)uVar12;
      *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
      bVar6 = false;
    }
    else {
      bVar7 = Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::increase_size((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)this);
      bVar6 = true;
      sVar10 = local_40;
      if (!bVar7) {
        bVar6 = false;
        sVar10 = 0;
        local_50 = 0;
      }
    }
LAB_0010f3be:
    if (!bVar6) goto LAB_0010f412;
    iVar9 = iVar9 + 1;
    local_40 = sVar10;
  } while (iVar9 != 0x100);
  local_50 = 0;
  sVar10 = 0;
LAB_0010f412:
  pVar15._8_8_ = local_50;
  pVar15.first = sVar10;
  return pVar15;
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }